

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool list_reversed(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  undefined8 *puVar1;
  gravity_object_t *pgVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_value_t *__ptr;
  gravity_fiber_t *fiber;
  char *pcVar5;
  char *pcVar6;
  long lVar8;
  gravity_value_t value;
  char _buffer [4096];
  gravity_class_t *pgVar7;
  
  if (nargs < 2) {
    pgVar2 = (args->field_1).p;
    aVar4.p = (gravity_object_t *)gravity_list_new(vm,*(uint32_t *)&pgVar2->objclass);
    for (lVar8 = (ulong)*(uint *)&pgVar2->objclass << 4; lVar8 != 0; lVar8 = lVar8 + -0x10) {
      pcVar5 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
      __ptr = *(gravity_value_t **)&(aVar4.p)->has_outer;
      if (pcVar5 == (aVar4.p)->identifier) {
        pcVar6 = (char *)((long)pcVar5 * 2);
        if (pcVar5 == (char *)0x0) {
          pcVar6 = (char *)0x8;
        }
        (aVar4.p)->identifier = pcVar6;
        __ptr = (gravity_value_t *)realloc(__ptr,(long)pcVar6 << 4);
        *(gravity_value_t **)&(aVar4.p)->has_outer = __ptr;
        pcVar5 = (char *)((gravity_value_r *)&(aVar4.p)->objclass)->n;
      }
      ((gravity_value_r *)&(aVar4.p)->objclass)->n = (size_t)(pcVar5 + 1);
      puVar1 = (undefined8 *)(*(long *)&pgVar2->has_outer + -0x10 + lVar8);
      aVar3 = *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(puVar1 + 1);
      __ptr[(long)pcVar5].isa = (gravity_class_t *)*puVar1;
      __ptr[(long)pcVar5].field_1 = aVar3;
    }
    pgVar7 = (aVar4.p)->isa;
  }
  else {
    builtin_strncpy(_buffer,"Incorrect number of arguments.",0x1f);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,_buffer);
    aVar4.n = 0;
    pgVar7 = gravity_class_null;
  }
  value.field_1.n = aVar4.n;
  value.isa = pgVar7;
  gravity_vm_setslot(vm,value,rindex);
  return nargs < 2;
}

Assistant:

static bool list_reversed (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs > 1) RETURN_ERROR("Incorrect number of arguments.");
    
    // self parameter
    gravity_list_t *list = VALUE_AS_LIST(GET_VALUE(0));
    gravity_list_t *newlist = gravity_list_new(vm, (uint32_t)list->array.n);
    uint32_t count = (uint32_t)marray_size(list->array);
    gravity_int_t i = 0;

    while (i < count) {
        marray_push(gravity_value_t, newlist->array, marray_get(list->array, count-i-1));
        ++i;
    }

    RETURN_VALUE(VALUE_FROM_OBJECT(newlist), rindex);
}